

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnFunctionBodyCount(BinaryReaderIR *this,Index count)

{
  Index IVar1;
  size_type sVar2;
  Index count_local;
  BinaryReaderIR *this_local;
  
  IVar1 = this->module_->num_func_imports;
  sVar2 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::size(&this->module_->funcs);
  if (IVar1 + count == sVar2) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    PrintError(this,
               "number of imported func + func count in code section does not match actual number of funcs in module"
              );
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnFunctionBodyCount(Index count) {
  // Can hit this case on a malformed module if we don't stop on first error.
  if (module_->num_func_imports + count != module_->funcs.size()) {
    PrintError(
        "number of imported func + func count in code section does not match "
        "actual number of funcs in module");
    return Result::Error;
  }
  return Result::Ok;
}